

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::EndTable(void)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  ImVec4 *pIVar3;
  float fVar4;
  float fVar5;
  char cVar6;
  short sVar7;
  ImGuiWindow *window;
  ImGuiWindow *pIVar8;
  ImDrawListSplitter *this;
  ulong uVar9;
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  int iVar13;
  ImGuiTableInstanceData *pIVar14;
  long lVar15;
  ImGuiTableTempData *pIVar16;
  char *pcVar17;
  ImGuiTableColumn *pIVar18;
  ImGuiTableColumn *column;
  ImGuiTable *pIVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  ImVec2 local_38;
  
  pIVar11 = GImGui;
  pIVar19 = GImGui->CurrentTable;
  if (pIVar19 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Only call EndTable() if BeginTable() returns true!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4b3,"void ImGui::EndTable()");
  }
  if (pIVar19->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar19);
  }
  window = pIVar19->InnerWindow;
  if (window != pIVar11->CurrentWindow) {
    __assert_fail("inner_window == g.CurrentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4c2,"void ImGui::EndTable()");
  }
  uVar22 = pIVar19->Flags;
  pIVar8 = pIVar19->OuterWindow;
  pIVar16 = pIVar19->TempData;
  if ((pIVar8 != window) && (pIVar8 != window->ParentWindow)) {
    __assert_fail("outer_window == inner_window || outer_window == inner_window->ParentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4c3,"void ImGui::EndTable()");
  }
  if (pIVar19->IsInsideRow == true) {
    TableEndRow(pIVar19);
  }
  if (((uVar22 & 0x20) != 0) && (pIVar19->HoveredColumnBody != -1)) {
    bVar12 = IsAnyItemHovered();
    if (!bVar12) {
      bVar12 = IsMouseReleased(1);
      if (bVar12) {
        TableOpenContextMenu((int)pIVar19->HoveredColumnBody);
      }
    }
  }
  sVar7 = pIVar19->InstanceCurrent;
  if (sVar7 == 0) {
    pIVar14 = &pIVar19->InstanceDataFirst;
  }
  else {
    if ((sVar7 < 1) || ((pIVar19->InstanceDataExtra).Size < (int)sVar7)) {
      pcVar17 = "T &ImVector<ImGuiTableInstanceData>::operator[](int) [T = ImGuiTableInstanceData]";
      goto LAB_0019482b;
    }
    pIVar14 = (pIVar19->InstanceDataExtra).Data + ((ulong)(uint)(int)sVar7 - 1);
  }
  (window->DC).PrevLineSize = pIVar16->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar16->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar16->HostBackupCursorMaxPos;
  fVar4 = pIVar19->RowPosY2;
  pfVar1 = &(window->DC).CursorPos.y;
  if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) {
    __assert_fail("table->RowPosY2 == inner_window->DC.CursorPos.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4d3,"void ImGui::EndTable()");
  }
  if (pIVar8 == window) {
    if ((uVar22 >> 0x11 & 1) == 0) {
      fVar26 = (pIVar19->OuterRect).Max.y;
      uVar21 = -(uint)(fVar4 <= fVar26);
      fVar26 = (float)(~uVar21 & (uint)fVar4 | (uint)fVar26 & uVar21);
      (pIVar19->InnerRect).Max.y = fVar26;
      (pIVar19->OuterRect).Max.y = fVar26;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar4;
  }
  fVar26 = (pIVar19->OuterRect).Max.y;
  fVar25 = (pIVar19->WorkRect).Max.y;
  uVar21 = -(uint)(fVar26 <= fVar25);
  (pIVar19->WorkRect).Max.y = (float)(~uVar21 & (uint)fVar26 | (uint)fVar25 & uVar21);
  pIVar14->LastOuterHeight = fVar26 - (pIVar19->OuterRect).Min.y;
  if (((uint)pIVar19->Flags >> 0x18 & 1) != 0) {
    fVar26 = (pIVar19->InnerWindow->DC).CursorMaxPos.x;
    cVar6 = pIVar19->RightMostEnabledColumn;
    if ((long)cVar6 != -1) {
      if ((cVar6 < '\0') ||
         (pIVar18 = (pIVar19->Columns).Data + cVar6, (pIVar19->Columns).DataEnd <= pIVar18))
      goto LAB_0019467c;
      fVar25 = 0.0;
      if (((uint)pIVar19->Flags >> 10 & 1) != 0) {
        fVar25 = 1.0;
      }
      fVar25 = (pIVar18->WorkMaxX + pIVar19->CellPaddingX + pIVar19->OuterPaddingX) - fVar25;
      uVar21 = -(uint)(fVar25 <= fVar26);
      fVar26 = (float)(uVar21 & (uint)fVar26 | ~uVar21 & (uint)fVar25);
    }
    if (pIVar19->ResizedColumn != -1) {
      uVar21 = -(uint)(pIVar19->ResizeLockMinContentsX2 <= fVar26);
      fVar26 = (float)((uint)fVar26 & uVar21 | ~uVar21 & (uint)pIVar19->ResizeLockMinContentsX2);
    }
    (pIVar19->InnerWindow->DC).CursorMaxPos.x = fVar26;
  }
  if ((uVar22 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  lVar15 = (long)(window->DrawList->_ClipRectStack).Size;
  if (lVar15 < 1) {
    pcVar17 = "T &ImVector<ImVec4>::back() [T = ImVec4]";
    goto LAB_00194743;
  }
  pIVar3 = (window->DrawList->_ClipRectStack).Data + lVar15 + -1;
  fVar26 = pIVar3->y;
  fVar25 = pIVar3->z;
  fVar24 = pIVar3->w;
  (window->ClipRect).Min.x = pIVar3->x;
  (window->ClipRect).Min.y = fVar26;
  (window->ClipRect).Max.x = fVar25;
  (window->ClipRect).Max.y = fVar24;
  if ((uVar22 & 0x780) != 0) {
    TableDrawBorders(pIVar19);
  }
  this = pIVar19->DrawSplitter;
  ImDrawListSplitter::SetCurrentChannel(this,window->DrawList,0);
  if ((pIVar19->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar19);
  }
  ImDrawListSplitter::Merge(this,window->DrawList);
  fVar26 = pIVar19->CellPaddingX + pIVar19->CellPaddingX;
  pIVar19->ColumnsAutoFitWidth =
       (float)(int)pIVar19->ColumnsEnabledCount * fVar26 +
       pIVar19->OuterPaddingX + pIVar19->OuterPaddingX +
       (float)(pIVar19->ColumnsEnabledCount + -1) *
       (pIVar19->CellSpacingX1 + pIVar19->CellSpacingX2);
  iVar13 = pIVar19->ColumnsCount;
  if (0 < (long)iVar13) {
    uVar9 = pIVar19->EnabledMaskByIndex;
    lVar15 = 0x10;
    uVar20 = 0;
    do {
      if ((uVar9 >> (uVar20 & 0x3f) & 1) != 0) {
        pIVar18 = (pIVar19->Columns).Data;
        column = (ImGuiTableColumn *)((long)pIVar18 + lVar15 + -0x10);
        if ((pIVar19->Columns).DataEnd <= column) goto LAB_0019467c;
        if ((column->Flags & 0x30U) == 0x10) {
          fVar25 = *(float *)((long)&pIVar18->Flags + lVar15);
        }
        else {
          fVar25 = TableGetColumnWidthAuto(pIVar19,column);
        }
        pIVar19->ColumnsAutoFitWidth = fVar25 + pIVar19->ColumnsAutoFitWidth;
      }
      uVar20 = uVar20 + 1;
      lVar15 = lVar15 + 0x68;
    } while ((long)iVar13 != uVar20);
  }
  if ((pIVar8 == window) || ((pIVar19->Flags & 0x1000000U) != 0)) {
    cVar6 = pIVar19->LastResizedColumn;
    if (((long)cVar6 != -1) &&
       (((pIVar19->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar19->InstanceInteracted == pIVar19->InstanceCurrent)))) {
      if ((cVar6 < '\0') ||
         (pIVar18 = (pIVar19->Columns).Data + cVar6, (pIVar19->Columns).DataEnd <= pIVar18))
      goto LAB_0019467c;
      fVar26 = fVar26 + pIVar19->MinColumnWidth;
      fVar25 = pIVar18->MaxX;
      if ((pIVar19->InnerClipRect).Min.x <= fVar25) {
        pIVar2 = &(pIVar19->InnerClipRect).Max;
        if (fVar25 < pIVar2->x || fVar25 == pIVar2->x) goto LAB_001942c4;
        fVar26 = fVar26 + (fVar25 - (window->Pos).x);
      }
      else {
        fVar26 = (fVar25 - (window->Pos).x) - fVar26;
      }
      SetScrollFromPosX(window,fVar26,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_001942c4:
  cVar6 = pIVar19->ResizedColumn;
  if (((long)cVar6 != -1) && (pIVar19->InstanceCurrent == pIVar19->InstanceInteracted)) {
    if ((cVar6 < '\0') ||
       (pIVar18 = (pIVar19->Columns).Data + cVar6, (pIVar19->Columns).DataEnd <= pIVar18)) {
LAB_0019467c:
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_internal.h"
                    ,599,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    pIVar19->ResizedColumnNextWidth =
         (float)(int)((((((pIVar11->IO).MousePos.x - (pIVar11->ActiveIdClickOffset).x) + 4.0) -
                       pIVar18->MinX) - pIVar19->CellSpacingX1) -
                     (pIVar19->CellPaddingX + pIVar19->CellPaddingX));
  }
  lVar15 = (long)(window->IDStack).Size;
  if (lVar15 < 1) {
    pcVar17 = "T &ImVector<unsigned int>::back() [T = unsigned int]";
LAB_00194743:
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                  ,0x758,pcVar17);
  }
  if ((window->IDStack).Data[lVar15 + -1] != (int)pIVar19->InstanceCurrent + pIVar19->ID) {
    __assert_fail("(inner_window->IDStack.back() == table->ID + table->InstanceCurrent) && \"Mismatching PushID/PopID!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x52d,"void ImGui::EndTable()");
  }
  if ((pIVar8->DC).ItemWidthStack.Size < pIVar16->HostBackupItemWidthStackSize) {
    __assert_fail("(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize) && \"Too many PopItemWidth!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x52e,"void ImGui::EndTable()");
  }
  PopID();
  fVar26 = (pIVar8->DC).CursorMaxPos.x;
  fVar25 = (pIVar8->DC).CursorMaxPos.y;
  IVar10 = (pIVar16->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar16->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar10;
  IVar10 = (pIVar16->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar16->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar10;
  window->SkipItems = pIVar19->HostSkipItems;
  (pIVar8->DC).CursorPos = (pIVar19->OuterRect).Min;
  (pIVar8->DC).ItemWidth = pIVar16->HostBackupItemWidth;
  (pIVar8->DC).ItemWidthStack.Size = pIVar16->HostBackupItemWidthStackSize;
  (pIVar8->DC).ColumnsOffset.x = (pIVar16->HostBackupColumnsOffset).x;
  if (pIVar8 == window) {
    local_38.x = (pIVar19->OuterRect).Max.x - (pIVar19->OuterRect).Min.x;
    local_38.y = (pIVar19->OuterRect).Max.y - (pIVar19->OuterRect).Min.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar19->OuterRect,0,(ImRect *)0x0,0);
  }
  else {
    EndChild();
  }
  uVar22 = pIVar19->Flags;
  if ((uVar22 >> 0x10 & 1) == 0) {
    fVar24 = (pIVar16->UserOuterSize).x;
    fVar23 = 0.0;
    if (fVar24 <= 0.0) {
      if ((uVar22 >> 0x18 & 1) != 0) {
        fVar23 = (window->ScrollbarSizes).x;
      }
      fVar27 = (pIVar19->OuterRect).Min.x + pIVar19->ColumnsAutoFitWidth;
      fVar5 = (pIVar8->DC).IdealMaxPos.x;
      fVar24 = (fVar23 + fVar27) - fVar24;
      uVar21 = -(uint)(fVar24 <= fVar5);
      (pIVar8->DC).IdealMaxPos.x = (float)(uVar21 & (uint)fVar5 | ~uVar21 & (uint)fVar24);
      fVar24 = (pIVar19->OuterRect).Max.x;
      if (fVar27 <= fVar24) {
        fVar24 = fVar27;
      }
    }
    else {
      fVar24 = (pIVar19->OuterRect).Max.x;
    }
  }
  else {
    if ((uVar22 >> 0x18 & 1) != 0) {
      __assert_fail("(table->Flags & ImGuiTableFlags_ScrollX) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0x54d,"void ImGui::EndTable()");
    }
    fVar24 = (pIVar19->OuterRect).Min.x + pIVar19->ColumnsAutoFitWidth;
  }
  uVar21 = -(uint)(fVar24 <= fVar26);
  (pIVar8->DC).CursorMaxPos.x = (float)(~uVar21 & (uint)fVar24 | (uint)fVar26 & uVar21);
  fVar26 = (pIVar16->UserOuterSize).y;
  fVar24 = 0.0;
  if (fVar26 <= 0.0) {
    if ((uVar22 >> 0x19 & 1) != 0) {
      fVar24 = (window->ScrollbarSizes).y;
    }
    fVar23 = (pIVar8->DC).IdealMaxPos.y;
    fVar26 = (fVar24 + fVar4) - fVar26;
    uVar22 = -(uint)(fVar26 <= fVar23);
    (pIVar8->DC).IdealMaxPos.y = (float)(uVar22 & (uint)fVar23 | ~uVar22 & (uint)fVar26);
    fVar26 = (pIVar19->OuterRect).Max.y;
    if (fVar4 <= fVar26) {
      fVar26 = fVar4;
    }
  }
  else {
    fVar26 = (pIVar19->OuterRect).Max.y;
  }
  uVar22 = -(uint)(fVar26 <= fVar25);
  (pIVar8->DC).CursorMaxPos.y = (float)(~uVar22 & (uint)fVar26 | (uint)fVar25 & uVar22);
  if (pIVar19->IsSettingsDirty == true) {
    TableSaveSettings(pIVar19);
  }
  pIVar19->IsInitializing = false;
  if ((pIVar11->CurrentWindow != pIVar8) || (pIVar11->CurrentTable != pIVar19)) {
    __assert_fail("g.CurrentWindow == outer_window && g.CurrentTable == table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x56c,"void ImGui::EndTable()");
  }
  iVar13 = pIVar11->TablesTempDataStacked;
  if (iVar13 < 1) {
    __assert_fail("g.TablesTempDataStacked > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x56d,"void ImGui::EndTable()");
  }
  pIVar11->TablesTempDataStacked = iVar13 + -1;
  if (iVar13 == 1) {
    pIVar16 = (ImGuiTableTempData *)0x0;
  }
  else {
    if ((pIVar11->TablesTempData).Size <= (int)(iVar13 - 2U)) {
      pcVar17 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
      goto LAB_0019482b;
    }
    pIVar16 = (pIVar11->TablesTempData).Data + (iVar13 - 2U);
  }
  if (pIVar16 == (ImGuiTableTempData *)0x0) {
    pIVar19 = (ImGuiTable *)0x0;
  }
  else {
    iVar13 = pIVar16->TableIndex;
    if (((long)iVar13 < 0) || ((pIVar11->Tables).Buf.Size <= iVar13)) {
      pcVar17 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
LAB_0019482b:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x74f,pcVar17);
    }
    pIVar19 = (pIVar11->Tables).Buf.Data + iVar13;
  }
  pIVar11->CurrentTable = pIVar19;
  if (pIVar19 == (ImGuiTable *)0x0) {
    iVar13 = -1;
  }
  else {
    pIVar19->TempData = pIVar16;
    pIVar19->DrawSplitter = &pIVar16->DrawSplitter;
    iVar13 = ImPool<ImGuiTable>::GetIndex(&pIVar11->Tables,pIVar19);
  }
  (pIVar8->DC).CurrentTableIdx = iVar13;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table_instance->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}